

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O1

void __thiscall
kj::UnixEventPort::FdObserver::FdObserver
          (FdObserver *this,UnixEventPort *eventPort,int fd,uint flags)

{
  int iVar1;
  epoll_event event;
  Fault f;
  undefined1 local_50 [16];
  Fault local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  this->eventPort = eventPort;
  this->fd = fd;
  this->flags = flags;
  (this->readFulfiller).ptr.disposer = (Disposer *)0x0;
  (this->readFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
  (this->writeFulfiller).ptr.disposer = (Disposer *)0x0;
  (this->writeFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
  (this->urgentFulfiller).ptr.disposer = (Disposer *)0x0;
  (this->urgentFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
  (this->hupFulfiller).ptr.disposer = (Disposer *)0x0;
  (this->hupFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
  (this->atEnd).ptr.isSet = false;
  local_50._1_2_ = 0;
  local_50[0] = (flags & 1) != 0;
  if ((bool)local_50[0]) {
    local_50._1_2_ = 0x20;
  }
  if ((flags & 2) != 0) {
    local_50[0] = local_50[0] | 4;
  }
  if ((flags & 4) != 0) {
    local_50[0] = local_50[0] | 2;
  }
  local_50[3] = 0x80;
  do {
    local_50._4_8_ = this;
    iVar1 = epoll_ctl((eventPort->epollFd).fd,1,fd,(epoll_event *)local_50);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
    this = (FdObserver *)local_50._4_8_;
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    return;
  }
  local_40.exception = (Exception *)0x0;
  local_38 = 0;
  uStack_30 = 0;
  kj::_::Debug::Fault::init
            (&local_40,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
            );
  kj::_::Debug::Fault::fatal(&local_40);
}

Assistant:

UnixEventPort::FdObserver::FdObserver(UnixEventPort& eventPort, int fd, uint flags)
    : eventPort(eventPort), fd(fd), flags(flags) {
  struct epoll_event event;
  memset(&event, 0, sizeof(event));

  if (flags & OBSERVE_READ) {
    event.events |= EPOLLIN | EPOLLRDHUP;
  }
  if (flags & OBSERVE_WRITE) {
    event.events |= EPOLLOUT;
  }
  if (flags & OBSERVE_URGENT) {
    event.events |= EPOLLPRI;
  }
  event.events |= EPOLLET;  // Set edge-triggered mode.

  event.data.ptr = this;

  KJ_SYSCALL(epoll_ctl(eventPort.epollFd, EPOLL_CTL_ADD, fd, &event));
}